

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeImportInfo
          (cmGeneratorTarget *this,string *desired_config,ImportInfo *info)

{
  cmValue *this_00;
  bool bVar1;
  TargetType TVar2;
  ManagedType MVar3;
  reference __args;
  string *psVar4;
  undefined8 uVar5;
  cmBTStringRange cVar6;
  string_view sVar7;
  allocator<char> local_6f9;
  string local_6f8;
  cmValue local_6d8;
  cmValue reps;
  cmValue config_reps;
  cmAlphaNum local_698;
  undefined1 local_668 [8];
  string linkProp_4;
  cmValue p;
  cmValue local_620;
  cmValue pc;
  undefined1 local_610 [8];
  string linkProp_3;
  string local_5e8;
  cmValue local_5c8;
  cmValue libs_1;
  cmValue config_libs_1;
  cmAlphaNum local_588;
  undefined1 local_558 [8];
  string linkProp_2;
  string local_530;
  cmValue local_510;
  cmValue libs;
  cmValue config_libs;
  cmAlphaNum local_4d0;
  undefined1 local_4a0 [8];
  string linkProp_1;
  string local_478;
  cmValue local_458;
  cmValue implib;
  cmValue config_implib;
  cmAlphaNum local_418;
  undefined1 local_3e8 [8];
  string impProp_1;
  allocator<char> local_3b1;
  string local_3b0;
  cmValue local_390;
  cmValue no_soname;
  cmValue local_378;
  cmValue config_no_soname;
  cmAlphaNum local_340;
  undefined1 local_310 [8];
  string soProp_1;
  string local_2e8;
  cmValue local_2c8;
  cmValue soname;
  cmValue config_soname;
  cmAlphaNum local_288;
  undefined1 local_258 [8];
  string soProp;
  string local_230;
  cmValue local_210;
  cmValue location;
  cmValue config_location;
  cmAlphaNum local_1d0;
  undefined1 local_1a0 [8];
  string impProp;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry_2;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __end1_1;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin1_1;
  cmBTStringRange *__range1_1;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry_1;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __end1;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin1;
  cmBTStringRange *__range1;
  cmValue local_118;
  cmValue propertyLibs;
  cmAlphaNum local_e0;
  undefined1 local_b0 [8];
  string linkProp;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __end2;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin2;
  cmBTStringRange *__range2;
  cmBTStringRange entries;
  undefined1 local_50 [8];
  string suffix;
  cmValue imp;
  cmValue loc;
  ImportInfo *info_local;
  string *desired_config_local;
  cmGeneratorTarget *this_local;
  
  info->NoSOName = false;
  cmValue::cmValue(&imp,(nullptr_t)0x0);
  this_00 = (cmValue *)((long)&suffix.field_2 + 8);
  cmValue::cmValue(this_00,(nullptr_t)0x0);
  std::__cxx11::string::string((string *)local_50);
  bVar1 = cmTarget::GetMappedConfig(this->Target,desired_config,&imp,this_00,(string *)local_50);
  if (bVar1) {
    cVar6 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
    entries.Begin = cVar6.End._M_current;
    __range2 = (cmBTStringRange *)cVar6.Begin._M_current;
    bVar1 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::empty((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)&__range2);
    if (bVar1) {
      TVar2 = GetType(this);
      if (TVar2 != INTERFACE_LIBRARY) {
        cmAlphaNum::cmAlphaNum(&local_e0,"IMPORTED_LINK_INTERFACE_LIBRARIES");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&propertyLibs,(string *)local_50);
        cmStrCat<>((string *)local_b0,&local_e0,(cmAlphaNum *)&propertyLibs);
        local_118 = GetProperty(this,(string *)local_b0);
        bVar1 = cmValue::operator_cast_to_bool(&local_118);
        if (!bVar1) {
          std::__cxx11::string::operator=((string *)local_b0,"IMPORTED_LINK_INTERFACE_LIBRARIES");
          local_118 = GetProperty(this,(string *)local_b0);
        }
        bVar1 = cmValue::operator_cast_to_bool(&local_118);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)&info->LibrariesProp,(string *)local_b0);
          psVar4 = cmValue::operator*[abi_cxx11_(&local_118);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &info->Libraries,psVar4);
        }
        std::__cxx11::string::~string((string *)local_b0);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&info->LibrariesProp,"INTERFACE_LINK_LIBRARIES");
      __end2 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::begin((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&__range2);
      entry = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::end((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&__range2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         *)&entry), bVar1) {
        linkProp.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator*(&__end2);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<BT<std::__cxx11::string>const&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   &info->Libraries,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)linkProp.field_2._8_8_);
        __gnu_cxx::
        __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&__end2);
      }
    }
    cVar6 = cmTarget::GetLinkInterfaceDirectEntries_abi_cxx11_(this->Target);
    __begin1 = cVar6.Begin._M_current;
    __end1 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::begin((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)&__begin1);
    entry_1 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::end((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&__begin1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&entry_1), bVar1) {
      __args = __gnu_cxx::
               __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end1);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<BT<std::__cxx11::string>const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &info->LibrariesHeadInclude,__args);
      __gnu_cxx::
      __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1);
    }
    cVar6 = cmTarget::GetLinkInterfaceDirectExcludeEntries_abi_cxx11_(this->Target);
    __begin1_1 = cVar6.Begin._M_current;
    __end1_1 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::begin((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&__begin1_1);
    entry_2 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::end((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)&__begin1_1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&entry_2), bVar1) {
      impProp.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&__end1_1);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<BT<std::__cxx11::string>const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &info->LibrariesHeadExclude,
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)impProp.field_2._8_8_);
      __gnu_cxx::
      __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1_1);
    }
    TVar2 = GetType(this);
    if (TVar2 == INTERFACE_LIBRARY) {
      bVar1 = cmValue::operator_cast_to_bool(&imp);
      if (bVar1) {
        psVar4 = cmValue::operator*[abi_cxx11_(&imp);
        std::__cxx11::string::operator=((string *)&info->LibName,(string *)psVar4);
      }
      entries.End._M_current._0_4_ = 1;
    }
    else {
      bVar1 = cmValue::operator_cast_to_bool(&imp);
      if (bVar1) {
        psVar4 = cmValue::operator*[abi_cxx11_(&imp);
        std::__cxx11::string::operator=((string *)&info->Location,(string *)psVar4);
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_1d0,"IMPORTED_LOCATION");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&config_location,(string *)local_50);
        cmStrCat<>((string *)local_1a0,&local_1d0,(cmAlphaNum *)&config_location);
        location = GetProperty(this,(string *)local_1a0);
        bVar1 = cmValue::operator_cast_to_bool(&location);
        if (bVar1) {
          psVar4 = cmValue::operator*[abi_cxx11_(&location);
          std::__cxx11::string::operator=((string *)&info->Location,(string *)psVar4);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_230,"IMPORTED_LOCATION",
                     (allocator<char> *)(soProp.field_2._M_local_buf + 0xf));
          local_210 = GetProperty(this,&local_230);
          std::__cxx11::string::~string((string *)&local_230);
          std::allocator<char>::~allocator((allocator<char> *)(soProp.field_2._M_local_buf + 0xf));
          bVar1 = cmValue::operator_cast_to_bool(&local_210);
          if (bVar1) {
            psVar4 = cmValue::operator*[abi_cxx11_(&local_210);
            std::__cxx11::string::operator=((string *)&info->Location,(string *)psVar4);
          }
        }
        std::__cxx11::string::~string((string *)local_1a0);
      }
      TVar2 = GetType(this);
      if (TVar2 == SHARED_LIBRARY) {
        cmAlphaNum::cmAlphaNum(&local_288,"IMPORTED_SONAME");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&config_soname,(string *)local_50);
        cmStrCat<>((string *)local_258,&local_288,(cmAlphaNum *)&config_soname);
        soname = GetProperty(this,(string *)local_258);
        bVar1 = cmValue::operator_cast_to_bool(&soname);
        if (bVar1) {
          psVar4 = cmValue::operator*[abi_cxx11_(&soname);
          std::__cxx11::string::operator=((string *)&info->SOName,(string *)psVar4);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,"IMPORTED_SONAME",
                     (allocator<char> *)(soProp_1.field_2._M_local_buf + 0xf));
          local_2c8 = GetProperty(this,&local_2e8);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::allocator<char>::~allocator((allocator<char> *)(soProp_1.field_2._M_local_buf + 0xf))
          ;
          bVar1 = cmValue::operator_cast_to_bool(&local_2c8);
          if (bVar1) {
            psVar4 = cmValue::operator*[abi_cxx11_(&local_2c8);
            std::__cxx11::string::operator=((string *)&info->SOName,(string *)psVar4);
          }
        }
        std::__cxx11::string::~string((string *)local_258);
      }
      TVar2 = GetType(this);
      if (TVar2 == SHARED_LIBRARY) {
        cmAlphaNum::cmAlphaNum(&local_340,"IMPORTED_NO_SONAME");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&config_no_soname,(string *)local_50);
        cmStrCat<>((string *)local_310,&local_340,(cmAlphaNum *)&config_no_soname);
        local_378 = GetProperty(this,(string *)local_310);
        bVar1 = cmValue::operator_cast_to_bool(&local_378);
        if (bVar1) {
          psVar4 = cmValue::operator*[abi_cxx11_(&local_378);
          sVar7 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
          no_soname.Value = (string *)sVar7._M_len;
          bVar1 = cmIsOn(sVar7);
          info->NoSOName = bVar1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3b0,"IMPORTED_NO_SONAME",&local_3b1);
          local_390 = GetProperty(this,&local_3b0);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::allocator<char>::~allocator(&local_3b1);
          bVar1 = cmValue::operator_cast_to_bool(&local_390);
          if (bVar1) {
            psVar4 = cmValue::operator*[abi_cxx11_(&local_390);
            sVar7 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
            impProp_1.field_2._8_8_ = sVar7._M_len;
            bVar1 = cmIsOn(sVar7);
            info->NoSOName = bVar1;
          }
        }
        std::__cxx11::string::~string((string *)local_310);
      }
      bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&suffix.field_2 + 8));
      if (bVar1) {
        psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&suffix.field_2 + 8));
        std::__cxx11::string::operator=((string *)&info->ImportLibrary,(string *)psVar4);
      }
      else {
        TVar2 = GetType(this);
        if ((TVar2 == SHARED_LIBRARY) || (bVar1 = IsExecutableWithExports(this), bVar1)) {
          cmAlphaNum::cmAlphaNum(&local_418,"IMPORTED_IMPLIB");
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)&config_implib,(string *)local_50);
          cmStrCat<>((string *)local_3e8,&local_418,(cmAlphaNum *)&config_implib);
          implib = GetProperty(this,(string *)local_3e8);
          bVar1 = cmValue::operator_cast_to_bool(&implib);
          if (bVar1) {
            psVar4 = cmValue::operator*[abi_cxx11_(&implib);
            std::__cxx11::string::operator=((string *)&info->ImportLibrary,(string *)psVar4);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_478,"IMPORTED_IMPLIB",
                       (allocator<char> *)(linkProp_1.field_2._M_local_buf + 0xf));
            local_458 = GetProperty(this,&local_478);
            std::__cxx11::string::~string((string *)&local_478);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(linkProp_1.field_2._M_local_buf + 0xf));
            bVar1 = cmValue::operator_cast_to_bool(&local_458);
            if (bVar1) {
              psVar4 = cmValue::operator*[abi_cxx11_(&local_458);
              std::__cxx11::string::operator=((string *)&info->ImportLibrary,(string *)psVar4);
            }
          }
          std::__cxx11::string::~string((string *)local_3e8);
        }
      }
      cmAlphaNum::cmAlphaNum(&local_4d0,"IMPORTED_LINK_DEPENDENT_LIBRARIES");
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)&config_libs,(string *)local_50);
      cmStrCat<>((string *)local_4a0,&local_4d0,(cmAlphaNum *)&config_libs);
      libs = GetProperty(this,(string *)local_4a0);
      bVar1 = cmValue::operator_cast_to_bool(&libs);
      if (bVar1) {
        psVar4 = cmValue::operator*[abi_cxx11_(&libs);
        std::__cxx11::string::operator=((string *)&info->SharedDeps,(string *)psVar4);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_530,"IMPORTED_LINK_DEPENDENT_LIBRARIES",
                   (allocator<char> *)(linkProp_2.field_2._M_local_buf + 0xf));
        local_510 = GetProperty(this,&local_530);
        std::__cxx11::string::~string((string *)&local_530);
        std::allocator<char>::~allocator((allocator<char> *)(linkProp_2.field_2._M_local_buf + 0xf))
        ;
        bVar1 = cmValue::operator_cast_to_bool(&local_510);
        if (bVar1) {
          psVar4 = cmValue::operator*[abi_cxx11_(&local_510);
          std::__cxx11::string::operator=((string *)&info->SharedDeps,(string *)psVar4);
        }
      }
      std::__cxx11::string::~string((string *)local_4a0);
      bVar1 = LinkLanguagePropagatesToDependents(this);
      if (bVar1) {
        cmAlphaNum::cmAlphaNum(&local_588,"IMPORTED_LINK_INTERFACE_LANGUAGES");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&config_libs_1,(string *)local_50);
        cmStrCat<>((string *)local_558,&local_588,(cmAlphaNum *)&config_libs_1);
        libs_1 = GetProperty(this,(string *)local_558);
        bVar1 = cmValue::operator_cast_to_bool(&libs_1);
        if (bVar1) {
          psVar4 = cmValue::operator*[abi_cxx11_(&libs_1);
          std::__cxx11::string::operator=((string *)&info->Languages,(string *)psVar4);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5e8,"IMPORTED_LINK_INTERFACE_LANGUAGES",
                     (allocator<char> *)(linkProp_3.field_2._M_local_buf + 0xf));
          local_5c8 = GetProperty(this,&local_5e8);
          std::__cxx11::string::~string((string *)&local_5e8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(linkProp_3.field_2._M_local_buf + 0xf));
          bVar1 = cmValue::operator_cast_to_bool(&local_5c8);
          if (bVar1) {
            psVar4 = cmValue::operator*[abi_cxx11_(&local_5c8);
            std::__cxx11::string::operator=((string *)&info->Languages,(string *)psVar4);
          }
        }
        std::__cxx11::string::~string((string *)local_558);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_610,"IMPORTED_COMMON_LANGUAGE_RUNTIME",
                 (allocator<char> *)((long)&pc.Value + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&pc.Value + 7));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      local_620 = GetProperty(this,(string *)&p);
      std::__cxx11::string::~string((string *)&p);
      bVar1 = cmValue::operator_cast_to_bool(&local_620);
      if (bVar1) {
        psVar4 = cmValue::operator*[abi_cxx11_(&local_620);
        MVar3 = CheckManagedType(this,psVar4);
        info->Managed = MVar3;
      }
      else {
        linkProp_4.field_2._8_8_ = GetProperty(this,(string *)local_610);
        bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&linkProp_4.field_2 + 8));
        if (bVar1) {
          psVar4 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&linkProp_4.field_2 + 8));
          MVar3 = CheckManagedType(this,psVar4);
          info->Managed = MVar3;
        }
      }
      std::__cxx11::string::~string((string *)local_610);
      TVar2 = GetType(this);
      if (TVar2 == STATIC_LIBRARY) {
        cmAlphaNum::cmAlphaNum(&local_698,"IMPORTED_LINK_INTERFACE_MULTIPLICITY");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&config_reps,(string *)local_50);
        cmStrCat<>((string *)local_668,&local_698,(cmAlphaNum *)&config_reps);
        reps = GetProperty(this,(string *)local_668);
        bVar1 = cmValue::operator_cast_to_bool(&reps);
        if (bVar1) {
          cmValue::operator->[abi_cxx11_(&reps);
          uVar5 = std::__cxx11::string::c_str();
          __isoc99_sscanf(uVar5,"%u",&info->Multiplicity);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6f8,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",&local_6f9);
          local_6d8 = GetProperty(this,&local_6f8);
          std::__cxx11::string::~string((string *)&local_6f8);
          std::allocator<char>::~allocator(&local_6f9);
          bVar1 = cmValue::operator_cast_to_bool(&local_6d8);
          if (bVar1) {
            cmValue::operator->[abi_cxx11_(&local_6d8);
            uVar5 = std::__cxx11::string::c_str();
            __isoc99_sscanf(uVar5,"%u",&info->Multiplicity);
          }
        }
        std::__cxx11::string::~string((string *)local_668);
      }
      entries.End._M_current._0_4_ = 0;
    }
  }
  else {
    entries.End._M_current._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeImportInfo(std::string const& desired_config,
                                          ImportInfo& info) const
{
  // This method finds information about an imported target from its
  // properties.  The "IMPORTED_" namespace is reserved for properties
  // defined by the project exporting the target.

  // Initialize members.
  info.NoSOName = false;

  cmValue loc = nullptr;
  cmValue imp = nullptr;
  std::string suffix;
  if (!this->Target->GetMappedConfig(desired_config, loc, imp, suffix)) {
    return;
  }

  // Get the link interface.
  {
    // Use the INTERFACE_LINK_LIBRARIES special representation directly
    // to get backtraces.
    cmBTStringRange entries = this->Target->GetLinkInterfaceEntries();
    if (!entries.empty()) {
      info.LibrariesProp = "INTERFACE_LINK_LIBRARIES";
      for (BT<std::string> const& entry : entries) {
        info.Libraries.emplace_back(entry);
      }
    } else if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      std::string linkProp =
        cmStrCat("IMPORTED_LINK_INTERFACE_LIBRARIES", suffix);
      cmValue propertyLibs = this->GetProperty(linkProp);
      if (!propertyLibs) {
        linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
        propertyLibs = this->GetProperty(linkProp);
      }
      if (propertyLibs) {
        info.LibrariesProp = linkProp;
        info.Libraries.emplace_back(*propertyLibs);
      }
    }
  }
  for (BT<std::string> const& entry :
       this->Target->GetLinkInterfaceDirectEntries()) {
    info.LibrariesHeadInclude.emplace_back(entry);
  }
  for (BT<std::string> const& entry :
       this->Target->GetLinkInterfaceDirectExcludeEntries()) {
    info.LibrariesHeadExclude.emplace_back(entry);
  }
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    if (loc) {
      info.LibName = *loc;
    }
    return;
  }

  // A provided configuration has been chosen.  Load the
  // configuration's properties.

  // Get the location.
  if (loc) {
    info.Location = *loc;
  } else {
    std::string impProp = cmStrCat("IMPORTED_LOCATION", suffix);
    if (cmValue config_location = this->GetProperty(impProp)) {
      info.Location = *config_location;
    } else if (cmValue location = this->GetProperty("IMPORTED_LOCATION")) {
      info.Location = *location;
    }
  }

  // Get the soname.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string soProp = cmStrCat("IMPORTED_SONAME", suffix);
    if (cmValue config_soname = this->GetProperty(soProp)) {
      info.SOName = *config_soname;
    } else if (cmValue soname = this->GetProperty("IMPORTED_SONAME")) {
      info.SOName = *soname;
    }
  }

  // Get the "no-soname" mark.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string soProp = cmStrCat("IMPORTED_NO_SONAME", suffix);
    if (cmValue config_no_soname = this->GetProperty(soProp)) {
      info.NoSOName = cmIsOn(*config_no_soname);
    } else if (cmValue no_soname = this->GetProperty("IMPORTED_NO_SONAME")) {
      info.NoSOName = cmIsOn(*no_soname);
    }
  }

  // Get the import library.
  if (imp) {
    info.ImportLibrary = *imp;
  } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->IsExecutableWithExports()) {
    std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
    if (cmValue config_implib = this->GetProperty(impProp)) {
      info.ImportLibrary = *config_implib;
    } else if (cmValue implib = this->GetProperty("IMPORTED_IMPLIB")) {
      info.ImportLibrary = *implib;
    }
  }

  // Get the link dependencies.
  {
    std::string linkProp =
      cmStrCat("IMPORTED_LINK_DEPENDENT_LIBRARIES", suffix);
    if (cmValue config_libs = this->GetProperty(linkProp)) {
      info.SharedDeps = *config_libs;
    } else if (cmValue libs =
                 this->GetProperty("IMPORTED_LINK_DEPENDENT_LIBRARIES")) {
      info.SharedDeps = *libs;
    }
  }

  // Get the link languages.
  if (this->LinkLanguagePropagatesToDependents()) {
    std::string linkProp =
      cmStrCat("IMPORTED_LINK_INTERFACE_LANGUAGES", suffix);
    if (cmValue config_libs = this->GetProperty(linkProp)) {
      info.Languages = *config_libs;
    } else if (cmValue libs =
                 this->GetProperty("IMPORTED_LINK_INTERFACE_LANGUAGES")) {
      info.Languages = *libs;
    }
  }

  // Get information if target is managed assembly.
  {
    std::string linkProp = "IMPORTED_COMMON_LANGUAGE_RUNTIME";
    if (cmValue pc = this->GetProperty(linkProp + suffix)) {
      info.Managed = this->CheckManagedType(*pc);
    } else if (cmValue p = this->GetProperty(linkProp)) {
      info.Managed = this->CheckManagedType(*p);
    }
  }

  // Get the cyclic repetition count.
  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    std::string linkProp =
      cmStrCat("IMPORTED_LINK_INTERFACE_MULTIPLICITY", suffix);
    if (cmValue config_reps = this->GetProperty(linkProp)) {
      sscanf(config_reps->c_str(), "%u", &info.Multiplicity);
    } else if (cmValue reps =
                 this->GetProperty("IMPORTED_LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps->c_str(), "%u", &info.Multiplicity);
    }
  }
}